

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

void __thiscall Highs::appendBasicRowsToBasisInterface(Highs *this,HighsInt ext_num_new_row)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  size_type __new_size;
  int iVar5;
  
  if ((ext_num_new_row != 0) && ((this->basis_).useful == true)) {
    bVar1 = (this->ekk_instance_).status_.has_basis;
    iVar5 = ext_num_new_row + (this->model_).lp_.num_row_;
    this_00 = &(this->basis_).row_status;
    __new_size = (size_type)iVar5;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(this_00,__new_size);
    uVar2 = (this->model_).lp_.num_row_;
    if ((int)uVar2 < iVar5) {
      memset((this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
             _M_impl.super__Vector_impl_data._M_start + (int)uVar2,1,(ulong)(iVar5 + ~uVar2) + 1);
    }
    if (bVar1 != false) {
      sVar4 = (long)(this->model_).lp_.num_col_ + __new_size;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&(this->ekk_instance_).basis_.nonbasicFlag_,sVar4);
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&(this->ekk_instance_).basis_.nonbasicMove_,sVar4);
      std::vector<int,_std::allocator<int>_>::resize
                (&(this->ekk_instance_).basis_.basicIndex_,__new_size);
      iVar3 = (this->model_).lp_.num_row_;
      sVar4 = (size_type)iVar3;
      if (iVar3 < iVar5) {
        do {
          (this->ekk_instance_).basis_.nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[sVar4 + (long)(this->model_).lp_.num_col_] = '\0';
          (this->ekk_instance_).basis_.nonbasicMove_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[sVar4 + (long)(this->model_).lp_.num_col_] = '\0';
          (this->ekk_instance_).basis_.basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar4] = (this->model_).lp_.num_col_ + (int)sVar4
          ;
          sVar4 = sVar4 + 1;
        } while (__new_size != sVar4);
      }
    }
  }
  return;
}

Assistant:

void Highs::appendBasicRowsToBasisInterface(const HighsInt ext_num_new_row) {
  if (ext_num_new_row == 0) return;
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.useful) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(highs_basis.col_status.size() == static_cast<size_t>(lp.num_col_));
  assert(highs_basis.row_status.size() == static_cast<size_t>(lp.num_row_));

  // Add basic logicals
  // Add the new rows to the Highs basis
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;
  highs_basis.row_status.resize(newNumRow);
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++)
    highs_basis.row_status[iRow] = HighsBasisStatus::kBasic;
  if (has_simplex_basis) {
    // Add the new rows to the simplex basis
    HighsInt newNumTot = lp.num_col_ + newNumRow;
    simplex_basis.nonbasicFlag_.resize(newNumTot);
    simplex_basis.nonbasicMove_.resize(newNumTot);
    simplex_basis.basicIndex_.resize(newNumRow);
    for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
      simplex_basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagFalse;
      simplex_basis.nonbasicMove_[lp.num_col_ + iRow] = 0;
      simplex_basis.basicIndex_[iRow] = lp.num_col_ + iRow;
    }
  }
}